

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_test.cpp
# Opt level: O3

void operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>,viennamath::ct_constant<8l>>
               (rt_expr<viennamath::rt_expression_interface<double>_> *e,
               rt_constant<long,_viennamath::rt_expression_interface<double>_> *t,ct_constant<8L> *u
               ,double t2,double u2)

{
  int iVar1;
  undefined4 extraout_var;
  op_interface<viennamath::rt_expression_interface<double>_> *poVar2;
  undefined4 extraout_var_00;
  rt_expression_interface<double> *prVar3;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  int iVar4;
  void *__child_stack;
  void *__child_stack_00;
  void *__child_stack_01;
  void *__child_stack_02;
  void *__child_stack_03;
  void *__child_stack_04;
  void *__child_stack_05;
  void *__child_stack_06;
  rt_constant<long,_viennamath::rt_expression_interface<double>_> *__fn;
  void *in_R8;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> local_68;
  double local_48;
  double local_40;
  double local_38;
  
  __fn = t;
  local_48 = t2;
  local_40 = u2;
  iVar1 = (*(t->super_rt_expression_interface<double>)._vptr_rt_expression_interface[2])(t);
  poVar2 = (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(8);
  poVar2->_vptr_op_interface = (_func_int **)&PTR__op_interface_0012f520;
  local_68.rhs_._M_ptr = (rt_expression_interface<double> *)operator_new(0x10);
  (local_68.rhs_._M_ptr)->_vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_expression_interface_0012f3a0;
  iVar4 = 0;
  local_68.rhs_._M_ptr[1]._vptr_rt_expression_interface = (_func_int **)0x4020000000000000;
  local_68.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_0012f0d0;
  local_68.lhs_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var,iVar1);
  local_68.op_._M_ptr = poVar2;
  iVar1 = viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::clone
                    (&local_68,(__fn *)__fn,__child_stack,0,in_R8);
  prVar3 = (e->rt_expr_)._M_ptr;
  if (prVar3 != (rt_expression_interface<double> *)CONCAT44(extraout_var_00,iVar1)) {
    if (prVar3 != (rt_expression_interface<double> *)0x0) {
      (*prVar3->_vptr_rt_expression_interface[1])();
    }
    (e->rt_expr_)._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_00,iVar1);
  }
  local_68.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_0012f0d0;
  if (local_68.rhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_68.rhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_68.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_68.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_68.lhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_68.lhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  local_38 = local_48 + local_40;
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>(e,local_38);
  prVar3 = (rt_expression_interface<double> *)operator_new(0x10);
  prVar3->_vptr_rt_expression_interface = (_func_int **)&PTR__rt_expression_interface_0012f3a0;
  prVar3[1]._vptr_rt_expression_interface = (_func_int **)0x4020000000000000;
  poVar2 = (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(8);
  poVar2->_vptr_op_interface = (_func_int **)&PTR__op_interface_0012f520;
  iVar1 = (*(t->super_rt_expression_interface<double>)._vptr_rt_expression_interface[2])(t);
  local_68.rhs_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_01,iVar1);
  local_68.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_0012f0d0;
  local_68.lhs_._M_ptr = prVar3;
  local_68.op_._M_ptr = poVar2;
  iVar1 = viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::clone
                    (&local_68,(__fn *)__fn,__child_stack_00,iVar4,in_R8);
  prVar3 = (e->rt_expr_)._M_ptr;
  if (prVar3 != (rt_expression_interface<double> *)CONCAT44(extraout_var_02,iVar1)) {
    if (prVar3 != (rt_expression_interface<double> *)0x0) {
      (*prVar3->_vptr_rt_expression_interface[1])();
    }
    (e->rt_expr_)._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_02,iVar1);
  }
  local_68.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_0012f0d0;
  if (local_68.rhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_68.rhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_68.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_68.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_68.lhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_68.lhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>(e,local_38);
  iVar1 = (*(t->super_rt_expression_interface<double>)._vptr_rt_expression_interface[2])(t);
  poVar2 = (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(8);
  poVar2->_vptr_op_interface = (_func_int **)&PTR__op_interface_0012f640;
  local_68.rhs_._M_ptr = (rt_expression_interface<double> *)operator_new(0x10);
  (local_68.rhs_._M_ptr)->_vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_expression_interface_0012f3a0;
  iVar4 = 0;
  local_68.rhs_._M_ptr[1]._vptr_rt_expression_interface = (_func_int **)0x4020000000000000;
  local_68.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_0012f0d0;
  local_68.lhs_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_03,iVar1);
  local_68.op_._M_ptr = poVar2;
  iVar1 = viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::clone
                    (&local_68,(__fn *)__fn,__child_stack_01,0,in_R8);
  prVar3 = (e->rt_expr_)._M_ptr;
  if (prVar3 != (rt_expression_interface<double> *)CONCAT44(extraout_var_04,iVar1)) {
    if (prVar3 != (rt_expression_interface<double> *)0x0) {
      (*prVar3->_vptr_rt_expression_interface[1])();
    }
    (e->rt_expr_)._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_04,iVar1);
  }
  local_68.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_0012f0d0;
  if (local_68.rhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_68.rhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_68.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_68.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_68.lhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_68.lhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>
            (e,local_48 - local_40);
  prVar3 = (rt_expression_interface<double> *)operator_new(0x10);
  prVar3->_vptr_rt_expression_interface = (_func_int **)&PTR__rt_expression_interface_0012f3a0;
  prVar3[1]._vptr_rt_expression_interface = (_func_int **)0x4020000000000000;
  poVar2 = (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(8);
  poVar2->_vptr_op_interface = (_func_int **)&PTR__op_interface_0012f640;
  iVar1 = (*(t->super_rt_expression_interface<double>)._vptr_rt_expression_interface[2])(t);
  local_68.rhs_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_05,iVar1);
  local_68.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_0012f0d0;
  local_68.lhs_._M_ptr = prVar3;
  local_68.op_._M_ptr = poVar2;
  iVar1 = viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::clone
                    (&local_68,(__fn *)__fn,__child_stack_02,iVar4,in_R8);
  prVar3 = (e->rt_expr_)._M_ptr;
  if (prVar3 != (rt_expression_interface<double> *)CONCAT44(extraout_var_06,iVar1)) {
    if (prVar3 != (rt_expression_interface<double> *)0x0) {
      (*prVar3->_vptr_rt_expression_interface[1])();
    }
    (e->rt_expr_)._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_06,iVar1);
  }
  local_68.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_0012f0d0;
  if (local_68.rhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_68.rhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_68.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_68.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_68.lhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_68.lhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>
            (e,local_40 - local_48);
  iVar1 = (*(t->super_rt_expression_interface<double>)._vptr_rt_expression_interface[2])(t);
  poVar2 = (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(8);
  poVar2->_vptr_op_interface = (_func_int **)&PTR__op_interface_0012f6d0;
  local_68.rhs_._M_ptr = (rt_expression_interface<double> *)operator_new(0x10);
  (local_68.rhs_._M_ptr)->_vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_expression_interface_0012f3a0;
  iVar4 = 0;
  local_68.rhs_._M_ptr[1]._vptr_rt_expression_interface = (_func_int **)0x4020000000000000;
  local_68.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_0012f0d0;
  local_68.lhs_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_07,iVar1);
  local_68.op_._M_ptr = poVar2;
  iVar1 = viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::clone
                    (&local_68,(__fn *)__fn,__child_stack_03,0,in_R8);
  prVar3 = (e->rt_expr_)._M_ptr;
  if (prVar3 != (rt_expression_interface<double> *)CONCAT44(extraout_var_08,iVar1)) {
    if (prVar3 != (rt_expression_interface<double> *)0x0) {
      (*prVar3->_vptr_rt_expression_interface[1])();
    }
    (e->rt_expr_)._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_08,iVar1);
  }
  local_68.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_0012f0d0;
  if (local_68.rhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_68.rhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_68.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_68.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_68.lhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_68.lhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  local_38 = local_48 * local_40;
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>(e,local_38);
  prVar3 = (rt_expression_interface<double> *)operator_new(0x10);
  prVar3->_vptr_rt_expression_interface = (_func_int **)&PTR__rt_expression_interface_0012f3a0;
  prVar3[1]._vptr_rt_expression_interface = (_func_int **)0x4020000000000000;
  poVar2 = (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(8);
  poVar2->_vptr_op_interface = (_func_int **)&PTR__op_interface_0012f6d0;
  iVar1 = (*(t->super_rt_expression_interface<double>)._vptr_rt_expression_interface[2])(t);
  local_68.rhs_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_09,iVar1);
  local_68.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_0012f0d0;
  local_68.lhs_._M_ptr = prVar3;
  local_68.op_._M_ptr = poVar2;
  iVar1 = viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::clone
                    (&local_68,(__fn *)__fn,__child_stack_04,iVar4,in_R8);
  prVar3 = (e->rt_expr_)._M_ptr;
  if (prVar3 != (rt_expression_interface<double> *)CONCAT44(extraout_var_10,iVar1)) {
    if (prVar3 != (rt_expression_interface<double> *)0x0) {
      (*prVar3->_vptr_rt_expression_interface[1])();
    }
    (e->rt_expr_)._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_10,iVar1);
  }
  local_68.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_0012f0d0;
  if (local_68.rhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_68.rhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_68.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_68.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_68.lhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_68.lhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>(e,local_38);
  iVar1 = (*(t->super_rt_expression_interface<double>)._vptr_rt_expression_interface[2])(t);
  poVar2 = (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(8);
  poVar2->_vptr_op_interface = (_func_int **)&PTR__op_interface_0012f7d0;
  local_68.rhs_._M_ptr = (rt_expression_interface<double> *)operator_new(0x10);
  (local_68.rhs_._M_ptr)->_vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_expression_interface_0012f3a0;
  iVar4 = 0;
  local_68.rhs_._M_ptr[1]._vptr_rt_expression_interface = (_func_int **)0x4020000000000000;
  local_68.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_0012f0d0;
  local_68.lhs_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_11,iVar1);
  local_68.op_._M_ptr = poVar2;
  iVar1 = viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::clone
                    (&local_68,(__fn *)__fn,__child_stack_05,0,in_R8);
  prVar3 = (e->rt_expr_)._M_ptr;
  if (prVar3 != (rt_expression_interface<double> *)CONCAT44(extraout_var_12,iVar1)) {
    if (prVar3 != (rt_expression_interface<double> *)0x0) {
      (*prVar3->_vptr_rt_expression_interface[1])();
    }
    (e->rt_expr_)._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_12,iVar1);
  }
  local_68.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_0012f0d0;
  if (local_68.rhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_68.rhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_68.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_68.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_68.lhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_68.lhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>
            (e,local_48 / local_40);
  prVar3 = (rt_expression_interface<double> *)operator_new(0x10);
  prVar3->_vptr_rt_expression_interface = (_func_int **)&PTR__rt_expression_interface_0012f3a0;
  prVar3[1]._vptr_rt_expression_interface = (_func_int **)0x4020000000000000;
  poVar2 = (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(8);
  poVar2->_vptr_op_interface = (_func_int **)&PTR__op_interface_0012f7d0;
  iVar1 = (*(t->super_rt_expression_interface<double>)._vptr_rt_expression_interface[2])(t);
  local_68.rhs_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_13,iVar1);
  local_68.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_0012f0d0;
  local_68.lhs_._M_ptr = prVar3;
  local_68.op_._M_ptr = poVar2;
  iVar1 = viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::clone
                    (&local_68,(__fn *)__fn,__child_stack_06,iVar4,in_R8);
  prVar3 = (e->rt_expr_)._M_ptr;
  if (prVar3 != (rt_expression_interface<double> *)CONCAT44(extraout_var_14,iVar1)) {
    if (prVar3 != (rt_expression_interface<double> *)0x0) {
      (*prVar3->_vptr_rt_expression_interface[1])();
    }
    (e->rt_expr_)._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_14,iVar1);
  }
  local_68.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_0012f0d0;
  if (local_68.rhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_68.rhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_68.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_68.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_68.lhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_68.lhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>
            (e,local_40 / local_48);
  return;
}

Assistant:

void operations_test(E & e, T const & t, U const & u, double t2, double u2)
{
  e = t + u; evaluations_test(e, t2 + u2);
  e = u + t; evaluations_test(e, u2 + t2);
  e = t - u; evaluations_test(e, t2 - u2);
  e = u - t; evaluations_test(e, u2 - t2);
  e = t * u; evaluations_test(e, t2 * u2);
  e = u * t; evaluations_test(e, u2 * t2);
  e = t / u; evaluations_test(e, t2 / u2);
  e = u / t; evaluations_test(e, u2 / t2);
}